

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_st_atomic(DisasContext_conflict10 *ctx,MemOp_conflict memop)

{
  ushort uVar1;
  TCGContext_conflict10 *s;
  TCGContext_conflict10 *tcg_ctx;
  TCGTemp *pTVar2;
  TCGv_i64 val;
  TCGTemp *ts;
  TCGv_i64 val_00;
  TCGTemp *ts_00;
  TCGTemp *ts_01;
  TCGTemp *ts_02;
  uintptr_t o_1;
  TCGv_i64 pTVar3;
  MemOp_conflict memop_00;
  TCGOpcode opc;
  uint uVar4;
  TCGv_i64 ret;
  uintptr_t o;
  TCGv_i64 ret_00;
  uintptr_t o_3;
  TCGv_i64 ret_01;
  TCGTemp *args [1];
  TCGTemp *local_38;
  
  s = ctx->uc->tcg_ctx;
  uVar4 = ctx->opcode;
  pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret_00 = (TCGv_i64)((long)pTVar2 - (long)s);
  tcg_ctx = ctx->uc->tcg_ctx;
  uVar1 = *(ushort *)((long)&ctx->opcode + 2);
  if ((uVar1 & 0x1f) == 0) {
    opc = INDEX_op_movi_i64;
    pTVar3 = (TCGv_i64)0x0;
  }
  else {
    pTVar3 = cpu_gpr[(ulong)uVar1 & 0x1f];
    if (ctx->sf_mode == false) {
      tcg_gen_ext32u_i64_ppc64(tcg_ctx,ret_00,pTVar3);
      goto LAB_00bd947c;
    }
    if (pTVar3 == ret_00) goto LAB_00bd947c;
    pTVar3 = pTVar3 + (long)tcg_ctx;
    opc = INDEX_op_mov_i64;
  }
  tcg_gen_op2_ppc64(tcg_ctx,opc,(TCGArg)((long)tcg_ctx + (long)ret_00),(TCGArg)pTVar3);
LAB_00bd947c:
  pTVar3 = *(TCGv_i64 *)((long)cpu_gpr + (ulong)(ctx->opcode >> 0x12 & 0xf8));
  pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
  ret_01 = (TCGv_i64)((long)pTVar2 - (long)s);
  memop_00 = memop | MO_ALIGN;
  uVar4 = uVar4 >> 0xb & 0x1f;
  switch(uVar4) {
  case 0:
    tcg_gen_atomic_add_fetch_i64_ppc64(s,ret_01,ret_00,pTVar3,(long)ctx->mem_idx,memop_00);
    break;
  case 1:
    tcg_gen_atomic_xor_fetch_i64_ppc64(s,ret_01,ret_00,pTVar3,(long)ctx->mem_idx,memop_00);
    break;
  case 2:
    tcg_gen_atomic_or_fetch_i64_ppc64(s,ret_01,ret_00,pTVar3,(long)ctx->mem_idx,memop_00);
    break;
  case 3:
    tcg_gen_atomic_and_fetch_i64_ppc64(s,ret_01,ret_00,pTVar3,(long)ctx->mem_idx,memop_00);
    break;
  case 4:
    tcg_gen_atomic_umax_fetch_i64_ppc64(s,ret_01,ret_00,pTVar3,(long)ctx->mem_idx,memop_00);
    break;
  case 5:
    tcg_gen_atomic_smax_fetch_i64_ppc64(s,ret_01,ret_00,pTVar3,(long)ctx->mem_idx,memop_00);
    break;
  case 6:
    tcg_gen_atomic_umin_fetch_i64_ppc64(s,ret_01,ret_00,pTVar3,(long)ctx->mem_idx,memop_00);
    break;
  case 7:
    tcg_gen_atomic_smin_fetch_i64_ppc64(s,ret_01,ret_00,pTVar3,(long)ctx->mem_idx,memop_00);
    break;
  default:
    if (uVar4 == 0x18) {
      if ((((ctx->base).tb)->cflags & 0x80000) == 0) {
        pTVar2 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
        val = (TCGv_i64)((long)pTVar2 - (long)s);
        ts = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
        val_00 = (TCGv_i64)((long)ts - (long)s);
        ts_00 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
        ts_01 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
        ts_02 = tcg_temp_new_internal_ppc64(s,TCG_TYPE_I64,false);
        ret = (TCGv_i64)((long)ts_02 - (long)s);
        tcg_gen_qemu_ld_i64_ppc64(s,val,ret_00,(long)ctx->mem_idx,memop_00);
        tcg_gen_addi_i64_ppc64(s,ret,ret_00,1L << ((byte)memop & 3));
        tcg_gen_qemu_ld_i64_ppc64(s,val_00,ret,(long)ctx->mem_idx,memop_00);
        tcg_gen_movcond_i64_ppc64
                  (s,TCG_COND_EQ,(TCGv_i64)((long)ts_00 - (long)s),val,val_00,pTVar3,val);
        tcg_gen_movcond_i64_ppc64
                  (s,TCG_COND_EQ,(TCGv_i64)((long)ts_01 - (long)s),val,val_00,pTVar3,val_00);
        tcg_gen_qemu_st_i64_ppc64
                  (s,(TCGv_i64)((long)ts_00 - (long)s),ret_00,(long)ctx->mem_idx,memop_00);
        tcg_gen_qemu_st_i64_ppc64
                  (s,(TCGv_i64)((long)ts_01 - (long)s),ret,(long)ctx->mem_idx,memop_00);
        tcg_temp_free_internal_ppc64(s,ts_02);
        tcg_temp_free_internal_ppc64(s,ts_01);
        tcg_temp_free_internal_ppc64(s,ts_00);
        tcg_temp_free_internal_ppc64(s,ts);
        tcg_temp_free_internal_ppc64(s,pTVar2);
      }
      else {
        local_38 = (TCGTemp *)(s->cpu_env + (long)s);
        tcg_gen_callN_ppc64(s,helper_exit_atomic_ppc64,(TCGTemp *)0x0,1,&local_38);
        (ctx->base).is_jmp = DISAS_NORETURN;
      }
    }
    else {
      gen_exception_err(ctx,2,0x20);
    }
  }
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_01 + (long)s));
  tcg_temp_free_internal_ppc64(s,(TCGTemp *)(ret_00 + (long)s));
  return;
}

Assistant:

static void gen_st_atomic(DisasContext *ctx, MemOp memop)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    uint32_t gpr_FC = FC(ctx->opcode);
    TCGv EA = tcg_temp_new(tcg_ctx);
    TCGv src, discard;

    gen_addr_register(ctx, EA);
    src = cpu_gpr[rD(ctx->opcode)];
    discard = tcg_temp_new(tcg_ctx);

    memop |= MO_ALIGN;
    switch (gpr_FC) {
    case 0: /* add and Store */
        tcg_gen_atomic_add_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 1: /* xor and Store */
        tcg_gen_atomic_xor_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 2: /* Or and Store */
        tcg_gen_atomic_or_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 3: /* 'and' and Store */
        tcg_gen_atomic_and_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 4:  /* Store max unsigned */
        tcg_gen_atomic_umax_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 5:  /* Store max signed */
        tcg_gen_atomic_smax_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 6:  /* Store min unsigned */
        tcg_gen_atomic_umin_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 7:  /* Store min signed */
        tcg_gen_atomic_smin_fetch_tl(tcg_ctx, discard, EA, src, ctx->mem_idx, memop);
        break;
    case 24: /* Store twin  */
        if (tb_cflags(ctx->base.tb) & CF_PARALLEL) {
            /* Restart with exclusive lock.  */
            gen_helper_exit_atomic(tcg_ctx, tcg_ctx->cpu_env);
            ctx->base.is_jmp = DISAS_NORETURN;
        } else {
            TCGv t = tcg_temp_new(tcg_ctx);
            TCGv t2 = tcg_temp_new(tcg_ctx);
            TCGv s = tcg_temp_new(tcg_ctx);
            TCGv s2 = tcg_temp_new(tcg_ctx);
            TCGv ea_plus_s = tcg_temp_new(tcg_ctx);

            tcg_gen_qemu_ld_tl(tcg_ctx, t, EA, ctx->mem_idx, memop);
            tcg_gen_addi_tl(tcg_ctx, ea_plus_s, EA, MEMOP_GET_SIZE(memop));
            tcg_gen_qemu_ld_tl(tcg_ctx, t2, ea_plus_s, ctx->mem_idx, memop);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, s, t, t2, src, t);
            tcg_gen_movcond_tl(tcg_ctx, TCG_COND_EQ, s2, t, t2, src, t2);
            tcg_gen_qemu_st_tl(tcg_ctx, s, EA, ctx->mem_idx, memop);
            tcg_gen_qemu_st_tl(tcg_ctx, s2, ea_plus_s, ctx->mem_idx, memop);

            tcg_temp_free(tcg_ctx, ea_plus_s);
            tcg_temp_free(tcg_ctx, s2);
            tcg_temp_free(tcg_ctx, s);
            tcg_temp_free(tcg_ctx, t2);
            tcg_temp_free(tcg_ctx, t);
        }
        break;
    default:
        /* invoke data storage error handler */
        gen_exception_err(ctx, POWERPC_EXCP_DSI, POWERPC_EXCP_INVAL);
    }
    tcg_temp_free(tcg_ctx, discard);
    tcg_temp_free(tcg_ctx, EA);
}